

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void __thiscall
duckdb::ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_>::ModeRm
          (ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *this,idx_t frame)

{
  DataChunk *result;
  ColumnDataScanState *state;
  hugeint_t *phVar1;
  size_t sVar2;
  idx_t iVar3;
  bool bVar4;
  reference pvVar5;
  mapped_type *pmVar6;
  
  state = this->scan;
  if ((state->next_row_index <= frame) || (frame < state->current_row_index)) {
    result = &this->page;
    ColumnDataCollection::Seek(this->inputs,frame,state,result);
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    this->data = (hugeint_t *)pvVar5->data;
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    FlatVector::VerifyFlatVector(pvVar5);
    this->validity = &pvVar5->validity;
  }
  iVar3 = this->scan->current_row_index;
  phVar1 = this->data;
  pmVar6 = ::std::__detail::
           _Map_base<duckdb::hugeint_t,_std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>,_std::allocator<std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::hugeint_t>,_std::hash<duckdb::hugeint_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<duckdb::hugeint_t,_std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>,_std::allocator<std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::hugeint_t>,_std::hash<duckdb::hugeint_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this->frequency_map,phVar1 + (uint)((int)frame - (int)iVar3));
  sVar2 = pmVar6->count;
  this->nonzero = this->nonzero - (ulong)(sVar2 == 1);
  pmVar6->count = sVar2 - 1;
  if (this->count == sVar2) {
    bVar4 = hugeint_t::operator==(phVar1 + (uint)((int)frame - (int)iVar3),this->mode);
    if (bVar4) {
      this->valid = false;
    }
  }
  return;
}

Assistant:

void ModeRm(idx_t frame) {
		const auto &key = GetCell(frame);
		auto &attr = (*frequency_map)[key];
		auto old_count = attr.count;
		nonzero -= size_t(old_count == 1);

		attr.count -= 1;
		if (count == old_count && key == *mode) {
			valid = false;
		}
	}